

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall
StatisticsWriter::writeHistograms
          (StatisticsWriter *this,ostream *stream,MultivariateTracker *tracker)

{
  pointer pSVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  ios *this_00;
  long lVar7;
  string name;
  string header;
  string local_d8;
  DynamicHistogram<double> local_b8;
  
  iVar4 = (int)((long)(tracker->_statistics).
                      super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(tracker->_statistics).
                      super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4f72c235;
  if (iVar4 == 0) {
    local_b8._vptr_DynamicHistogram = (_func_int **)&local_b8._binMax;
    std::__cxx11::string::_M_construct((string *)&local_b8,0x14,'=');
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                        (this->_comment)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_b8._vptr_DynamicHistogram,local_b8._8_8_);
    cVar3 = std::ios::widen((ios *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18)),'\n');
    poVar5 = (ostream *)std::ostream::put(poVar5,cVar3);
    std::ostream::flush(poVar5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                        (this->_comment)._M_string_length);
    lVar6 = *(long *)poVar5;
    this_00 = (ios *)(poVar5 + *(long *)(lVar6 + -0x18));
    if (poVar5[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen(this_00,' ');
      this_00[0xe1] = (ios)0x1;
      lVar6 = *(long *)poVar5;
    }
    this_00[0xe0] = (ios)0x20;
    *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x10) = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Histograms",10);
    cVar3 = std::ios::widen((ios *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18)),'\n');
    poVar5 = (ostream *)std::ostream::put(poVar5,cVar3);
    std::ostream::flush(poVar5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                        (this->_comment)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_b8._vptr_DynamicHistogram,local_b8._8_8_);
    cVar3 = std::ios::widen((ios *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18)),'\n');
    poVar5 = (ostream *)std::ostream::put(poVar5,cVar3);
    std::ostream::flush(poVar5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                        (this->_comment)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"No valid data",0xd);
    cVar3 = std::ios::widen((ios *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18)),'\n');
    poVar5 = (ostream *)std::ostream::put(poVar5,cVar3);
    std::ostream::flush(poVar5);
    if (local_b8._vptr_DynamicHistogram != (_func_int **)&local_b8._binMax) {
      operator_delete(local_b8._vptr_DynamicHistogram,(long)local_b8._binMax + 1);
    }
  }
  else {
    lVar6 = (long)iVar4;
    if (0 < lVar6) {
      lVar7 = 0;
      do {
        pSVar1 = (tracker->_statistics).
                 super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar2 = *(long *)((long)&(pSVar1->_name)._M_dataplus._M_p + lVar7);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,lVar2,
                   *(long *)((long)&(pSVar1->_name)._M_string_length + lVar7) + lVar2);
        StatisticsTracker::getHistogram
                  (&local_b8,
                   (StatisticsTracker *)
                   ((long)&((tracker->_statistics).
                            super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_count + lVar7));
        writeHistogram<double>(this,stream,&local_d8,&local_b8);
        DynamicHistogram<double>::~DynamicHistogram(&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        lVar7 = lVar7 + 0xe8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  return;
}

Assistant:

void
    writeHistograms(std::ostream & stream,
                    MultivariateTracker & tracker)
    {
        
        int numDim = tracker.getDimension();

        // Print no data header
        if (numDim == 0)
        {
            int totalWidth = 20;
            std::string header(totalWidth,'='); 
            stream << this->_comment << header << std::endl;
            stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << "Histograms" << std::endl;
            stream << this->_comment << header << std::endl;
            stream << this->_comment << "No valid data" << std::endl;
            return;
        }

        for (long i = 0; i < numDim; i++)
        {
            const std::string name = tracker.getName(i);
            DynamicHistogram<double> histogram = tracker.getHistogram(i);
            this->writeHistogram<double>(stream, name, histogram);
        }

        return;
    }